

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O1

Result __thiscall MemTable::skipSearch(MemTable *this,LevelIter level,longlong key)

{
  _List_node_base *p_Var1;
  QuadListNode<SSTableDataEntry> *pQVar2;
  QuadListNode<SSTableDataEntry> *pQVar3;
  undefined1 auVar4 [16];
  QuadListNode<SSTableDataEntry> *pQVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  Result RVar8;
  
  pQVar5 = (QuadListNode<SSTableDataEntry> *)level._M_node[1]._M_prev[4]._M_prev;
  p_Var1 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  do {
    pQVar2 = (QuadListNode<SSTableDataEntry> *)level._M_node[1]._M_prev;
    if ((pQVar5 != (QuadListNode<SSTableDataEntry> *)0x0) && (pQVar2 != pQVar5)) {
      do {
        if ((((QuadListNode<SSTableDataEntry> *)level._M_node[2]._M_next == pQVar5) ||
            (key < (pQVar5->data).key)) ||
           (pQVar5 = pQVar5->succ, pQVar5 == (QuadListNode<SSTableDataEntry> *)0x0)) break;
      } while (pQVar2 != pQVar5);
    }
    pQVar3 = pQVar5->pred;
    if ((((pQVar3->data).key == key) && (pQVar3 != (QuadListNode<SSTableDataEntry> *)0x0)) &&
       ((pQVar2 != pQVar3 && ((QuadListNode<SSTableDataEntry> *)level._M_node[2]._M_next != pQVar3))
       )) {
      do {
        pQVar5 = pQVar3;
        pQVar3 = pQVar5->below;
      } while (pQVar3 != (QuadListNode<SSTableDataEntry> *)0x0);
      RVar8._1_7_ = (undefined7)((ulong)p_Var1 >> 8);
      RVar8.valid = true;
      RVar8.node = pQVar5;
      return RVar8;
    }
    pQVar5 = pQVar3;
    p_Var6 = level._M_node;
    if (level._M_node != p_Var1) {
      p_Var6 = (level._M_node)->_M_next;
      pQVar5 = pQVar3->below;
      if (pQVar5 == (QuadListNode<SSTableDataEntry> *)0x0) {
        pQVar5 = (QuadListNode<SSTableDataEntry> *)p_Var6[1]._M_prev[4]._M_prev;
      }
    }
    bVar7 = level._M_node == p_Var1;
    level._M_node = p_Var6;
    if (bVar7) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pQVar3;
      return (Result)(auVar4 << 0x40);
    }
  } while( true );
}

Assistant:

auto MemTable::skipSearch(MemTable::LevelIter level, long long key) {
    struct Result {
        bool valid;
        decltype(level->first()->succ) node;
    };
    auto *curr_node = level->first()->succ;
    auto result = Result{false, nullptr};
    while (true) {
        while (level->valid(curr_node) && curr_node->data.key <= key)
            curr_node = curr_node->succ;
        curr_node = curr_node->pred;
        result.node = curr_node;
        if (curr_node->data.key == key && level->valid(curr_node)) {
            result.valid = true;
            while (result.node->below) {
                result.node = result.node->below;
                // If k found, move to the bottom of its tower for better removing.
                // Though it has been marked as deleted, it should be return for further use like put.
                // This loop unable to process curr_node is header or trailer of level.
            }
            /*if (!level->valid(curr_node)) {
                if (curr_node == level->first()) {
                    result.node = qlist.rbegin()->first();
                }
                if (curr_node == level->last()) {
                    result.node = qlist.rbegin()->last();
                }
            }*/
            return result;
        }
        auto r = --qlist.rbegin().base();
        if (level == r) break;
        level++;
        if (curr_node->below) { // header and trailer node of a QuadList has no above or below. Their tower can be formed by qlist.
            curr_node = curr_node->below;
        } else {
            curr_node = level->first()->succ;
        }
    }

    return result;
}